

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printHelp(Output *output,bool extended)

{
  byte in_SIL;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x18))
            (in_RDI,
             "qgrep %s (http://github.com/zeux/qgrep)\n\nBasic commands:\n  qgrep init <project> <path>\n  qgrep update <project-list>\n  qgrep search <project-list> <search-options> <query>\n  qgrep watch <project-list>\n  qgrep interactive <project-list>\n  qgrep help\n"
             ,kVersion);
  if ((in_SIL & 1) != 0) {
    (**(code **)(*in_RDI + 0x18))
              (in_RDI,
               "\nAdvanced commands:\n  qgrep build <project-list>\n  qgrep change <project-list> <file-list>\n  qgrep files <project-list>\n  qgrep files <project-list> <search-options> <query>\n  qgrep filter <search-options> <query>\n  qgrep info <project-list>\n  qgrep projects\n"
              );
  }
  (**(code **)(*in_RDI + 0x18))
            (in_RDI,
             "\n<project> is a project name (stored in ~/.qgrep) or a path to .cfg file\n<project-list> is * or % (all projects) or a comma-separated list of names\n<query> is a regular expression\n\n<search-options> can include:\n  i - case-insensitive search          l - literal (substring) search\n  V - Visual Studio formatting         S - print search summary\n"
            );
  if ((in_SIL & 1) != 0) {
    (**(code **)(*in_RDI + 0x18))
              (in_RDI,
               "  C - output match column number       CE - output match starting and ending column numbers\n  L<num> - limit output to <num> lines\n\n<search-options> can include flags for restricting searches to certain files:\n  fi<re> - only search in files with paths matching regex <re>\n  fe<re> - don\'t search in files with paths matching regex <re>\n\n<search-options> can include additional options for output highlighting:\n  H - force enable highlighting        HD - force disable highlighting\n      (default for TTY output)         HM - only highlight search matches\n\n<search-options> can include additional options for files/filter commands:\n  fp - search in file paths (default)  fn - search in file names\n  ff - fuzzy search with ranking       fs - search for space-delimited words\n\nin interactive mode, you can input \'search\' and \'files\' commands without a project list.\n"
              );
  }
  return;
}

Assistant:

void printHelp(Output* output, bool extended)
{
	output->print(
"qgrep %s (http://github.com/zeux/qgrep)\n"
"\n"
"Basic commands:\n"
"  qgrep init <project> <path>\n"
"  qgrep update <project-list>\n"
"  qgrep search <project-list> <search-options> <query>\n"
"  qgrep watch <project-list>\n"
"  qgrep interactive <project-list>\n"
"  qgrep help\n", kVersion);

    if (extended)
        output->print(
"\n"
"Advanced commands:\n"
"  qgrep build <project-list>\n"
"  qgrep change <project-list> <file-list>\n"
"  qgrep files <project-list>\n"
"  qgrep files <project-list> <search-options> <query>\n"
"  qgrep filter <search-options> <query>\n"
"  qgrep info <project-list>\n"
"  qgrep projects\n");

    output->print(
"\n"
"<project> is a project name (stored in ~/.qgrep) or a path to .cfg file\n"
"<project-list> is * or % (all projects) or a comma-separated list of names\n"
"<query> is a regular expression\n"
"\n"
"<search-options> can include:\n"
"  i - case-insensitive search          l - literal (substring) search\n"
"  V - Visual Studio formatting         S - print search summary\n");

    if (extended)
        output->print(
"  C - output match column number       CE - output match starting and ending column numbers\n"
"  L<num> - limit output to <num> lines\n"
"\n"
"<search-options> can include flags for restricting searches to certain files:\n"
"  fi<re> - only search in files with paths matching regex <re>\n"
"  fe<re> - don't search in files with paths matching regex <re>\n"
"\n"
"<search-options> can include additional options for output highlighting:\n"
"  H - force enable highlighting        HD - force disable highlighting\n"
"      (default for TTY output)         HM - only highlight search matches\n"  
"\n"
"<search-options> can include additional options for files/filter commands:\n"
"  fp - search in file paths (default)  fn - search in file names\n"
"  ff - fuzzy search with ranking       fs - search for space-delimited words\n"
"\n"
"in interactive mode, you can input 'search' and 'files' commands without a project list.\n");
}